

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.cpp
# Opt level: O3

int __thiscall TPZPrInteg<TPZIntTriang>::NPoints(TPZPrInteg<TPZIntTriang> *this)

{
  return this->fIntP->fNumInt * ((this->super_TPZIntTriang).fIntKsi)->fNumInt;
}

Assistant:

int TPZIntTriang::NPoints() const {
#ifdef PZDEBUG
	if (!fIntKsi){
		PZError << "Null Pointer passed to method TPZIntTriang::NPoints()\n";
        DebugStop();
		return 0;
	}
#endif
	return fIntKsi->NInt();
}